

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

bool is_affected(CHAR_DATA *ch,int sn)

{
  AFFECT_DATA *paf;
  int sn_local;
  CHAR_DATA *ch_local;
  
  if (ch != (CHAR_DATA *)0x0) {
    for (paf = ch->affected; paf != (AFFECT_DATA *)0x0; paf = paf->next) {
      if (paf->type == sn) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_affected(CHAR_DATA *ch, int sn)
{
	AFFECT_DATA *paf;

	if (!ch)
		return false;

	for (paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->type == sn)
			return true;
	}

	return false;
}